

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNodes_Common.h
# Opt level: O1

void __thiscall
psy::C::AmbiguousTypeNameOrExpressionAsTypeReferenceSyntax::
~AmbiguousTypeNameOrExpressionAsTypeReferenceSyntax
          (AmbiguousTypeNameOrExpressionAsTypeReferenceSyntax *this)

{
  SyntaxNode::~SyntaxNode((SyntaxNode *)this);
  Managed::operator_delete(this);
  return;
}

Assistant:

class PSY_C_API AmbiguousTypeNameOrExpressionAsTypeReferenceSyntax final : public TypeReferenceSyntax
{
    AST_NODE_1K(AmbiguousTypeNameOrExpressionAsTypeReference, TypeReference)

public:
    const ExpressionAsTypeReferenceSyntax* expressionAsTypeReference() const { return exprAsTyRef_; }
    const TypeNameAsTypeReferenceSyntax* typeNameAsTypeReference() const { return tyNameAsTyRef_; }

private:
    ExpressionAsTypeReferenceSyntax* exprAsTyRef_ = nullptr;
    TypeNameAsTypeReferenceSyntax* tyNameAsTyRef_ = nullptr;
    AST_CHILD_LST2(exprAsTyRef_, tyNameAsTyRef_);
}